

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name-tree.c
# Opt level: O3

void ndn_nametree_init(void *memory,ndn_table_id_t capacity)

{
  short sVar1;
  undefined6 in_register_00000032;
  long lVar2;
  
  if ((int)CONCAT62(in_register_00000032,capacity) != 0) {
    sVar1 = 1;
    lVar2 = 0;
    do {
      *(undefined4 *)((long)memory + lVar2 + 0x2a) = 0xffffffff;
      *(undefined2 *)((long)memory + lVar2 + 0x26) = 0xffff;
      *(short *)((long)memory + lVar2 + 0x28) = sVar1;
      lVar2 = lVar2 + 0x2e;
      sVar1 = sVar1 + 1;
    } while ((ulong)capacity * 0x2e - lVar2 != 0);
  }
  *(undefined2 *)((ulong)capacity * 0x2e + -6 + (long)memory) = 0xffff;
  return;
}

Assistant:

void
ndn_nametree_init(void* memory, ndn_table_id_t capacity)
{
  ndn_nametree_t *nametree = (ndn_nametree_t*)memory;
  //all free entries are linked as right_bro of (*nametree)[0], the root of the tree.
  for (int i = 0; i < capacity; ++i) {
    (*nametree)[i].left_child = (*nametree)[i].pit_id = (*nametree)[i].fib_id = NDN_INVALID_ID;
    (*nametree)[i].right_bro = i + 1;
  }
  (*nametree)[capacity - 1].right_bro = NDN_INVALID_ID;
}